

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoApi.c
# Opt level: O3

void Extra_ReorderQuit(reo_man *p)

{
  if (p->pTops != (reo_unit **)0x0) {
    free(p->pTops);
    p->pTops = (reo_unit **)0x0;
  }
  if (p->pSupp != (int *)0x0) {
    free(p->pSupp);
    p->pSupp = (int *)0x0;
  }
  if (p->pOrderInt != (int *)0x0) {
    free(p->pOrderInt);
    p->pOrderInt = (int *)0x0;
  }
  if (p->pWidthCofs != (reo_unit **)0x0) {
    free(p->pWidthCofs);
    p->pWidthCofs = (reo_unit **)0x0;
  }
  if (p->pMapToPlanes != (int *)0x0) {
    free(p->pMapToPlanes);
    p->pMapToPlanes = (int *)0x0;
  }
  if (p->pMapToDdVarsOrig != (int *)0x0) {
    free(p->pMapToDdVarsOrig);
    p->pMapToDdVarsOrig = (int *)0x0;
  }
  if (p->pMapToDdVarsFinal != (int *)0x0) {
    free(p->pMapToDdVarsFinal);
    p->pMapToDdVarsFinal = (int *)0x0;
  }
  if (p->pPlanes != (reo_plane *)0x0) {
    free(p->pPlanes);
    p->pPlanes = (reo_plane *)0x0;
  }
  if (p->pVarCosts != (double *)0x0) {
    free(p->pVarCosts);
    p->pVarCosts = (double *)0x0;
  }
  if (p->pLevelOrder != (int *)0x0) {
    free(p->pLevelOrder);
    p->pLevelOrder = (int *)0x0;
  }
  if (p->HTable != (reo_hash *)0x0) {
    free(p->HTable);
    p->HTable = (reo_hash *)0x0;
  }
  if (p->pRefNodes != (DdNode **)0x0) {
    free(p->pRefNodes);
    p->pRefNodes = (DdNode **)0x0;
  }
  reoUnitsStopDispenser(p);
  if (p->pMemChunks != (reo_unit **)0x0) {
    free(p->pMemChunks);
  }
  free(p);
  return;
}

Assistant:

void Extra_ReorderQuit( reo_man * p )
{
    ABC_FREE( p->pTops );
    ABC_FREE( p->pSupp );
    ABC_FREE( p->pOrderInt );
    ABC_FREE( p->pWidthCofs );
    ABC_FREE( p->pMapToPlanes );
    ABC_FREE( p->pMapToDdVarsOrig );
    ABC_FREE( p->pMapToDdVarsFinal );
    ABC_FREE( p->pPlanes );
    ABC_FREE( p->pVarCosts );
    ABC_FREE( p->pLevelOrder );
    ABC_FREE( p->HTable );
    ABC_FREE( p->pRefNodes );
    reoUnitsStopDispenser( p );
    ABC_FREE( p->pMemChunks );
    ABC_FREE( p );
}